

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

pointer __thiscall
slang::SmallVectorBase<std::basic_string_view<char,std::char_traits<char>>>::
emplaceRealloc<std::basic_string_view<char,std::char_traits<char>>>
          (SmallVectorBase<std::basic_string_view<char,std::char_traits<char>>> *this,pointer pos,
          basic_string_view<char,_std::char_traits<char>_> *args)

{
  ulong uVar1;
  char *pcVar2;
  size_t *psVar3;
  pointer pbVar4;
  long lVar5;
  size_t *psVar6;
  long lVar7;
  ulong capacity;
  
  if (*(long *)(this + 8) == 0x7fffffffffffffff) {
    detail::throwLengthError();
  }
  capacity = *(long *)(this + 8) + 1;
  uVar1 = *(ulong *)(this + 0x10);
  if (capacity < uVar1 * 2) {
    capacity = uVar1 * 2;
  }
  if (0x7fffffffffffffff - uVar1 < uVar1) {
    capacity = 0x7fffffffffffffff;
  }
  lVar7 = (long)pos - *(long *)this;
  psVar3 = (size_t *)detail::allocArray(capacity,0x10);
  pcVar2 = args->_M_str;
  *(size_t *)((long)psVar3 + lVar7) = args->_M_len;
  ((size_t *)((long)psVar3 + lVar7))[1] = (size_t)pcVar2;
  pbVar4 = *(pointer *)this;
  lVar5 = *(long *)(this + 8);
  if (pbVar4 + lVar5 == pos) {
    psVar6 = psVar3;
    if (lVar5 != 0) {
      do {
        pcVar2 = pbVar4->_M_str;
        *psVar6 = pbVar4->_M_len;
        psVar6[1] = (size_t)pcVar2;
        pbVar4 = pbVar4 + 1;
        psVar6 = psVar6 + 2;
      } while (pbVar4 != pos);
    }
  }
  else {
    psVar6 = psVar3;
    if (pbVar4 != pos) {
      do {
        pcVar2 = pbVar4->_M_str;
        *psVar6 = pbVar4->_M_len;
        psVar6[1] = (size_t)pcVar2;
        pbVar4 = pbVar4 + 1;
        psVar6 = psVar6 + 2;
      } while (pbVar4 != pos);
      pbVar4 = *(pointer *)this;
      lVar5 = *(long *)(this + 8);
    }
    if (pbVar4 + lVar5 != pos) {
      psVar6 = (size_t *)((long)psVar3 + lVar7);
      do {
        pcVar2 = pos->_M_str;
        psVar6[2] = pos->_M_len;
        psVar6[3] = (size_t)pcVar2;
        pos = pos + 1;
        psVar6 = psVar6 + 2;
      } while (pos != pbVar4 + lVar5);
    }
  }
  if (*(SmallVectorBase<std::basic_string_view<char,std::char_traits<char>>> **)this != this + 0x18)
  {
    free(*(SmallVectorBase<std::basic_string_view<char,std::char_traits<char>>> **)this);
  }
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  *(ulong *)(this + 0x10) = capacity;
  *(size_t **)this = psVar3;
  return (pointer)((long)psVar3 + lVar7);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}